

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,ZeroCopyOutputStream *output)

{
  bool bVar1;
  TextGenerator generator;
  TextGenerator local_38;
  
  local_38.indent_level_ = this->initial_indent_level_;
  local_38.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_0067f9a0;
  local_38.buffer_ = (char *)0x0;
  local_38.buffer_size_ = 0;
  local_38.at_start_of_line_ = true;
  local_38.failed_ = false;
  local_38.output_ = output;
  local_38.initial_indent_level_ = local_38.indent_level_;
  PrintUnknownFields(this,unknown_fields,&local_38);
  bVar1 = local_38.failed_;
  local_38.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_0067f9a0;
  if ((local_38.failed_ == false) && (0 < local_38.buffer_size_)) {
    (*(local_38.output_)->_vptr_ZeroCopyOutputStream[3])();
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields,
    io::ZeroCopyOutputStream* output) const {
  TextGenerator generator(output, initial_indent_level_);

  PrintUnknownFields(unknown_fields, &generator);

  // Output false if the generator failed internally.
  return !generator.failed();
}